

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::AddProperty
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,Var value,PropertyAttributes attributes,
          PropertyValueInfo *info,PropertyOperationFlags flags,bool throwIfNotExtensible,
          SideEffects possibleSideEffects)

{
  Type *pTVar1;
  int iVar2;
  RecyclerWeakReference<Js::DynamicObject> *pRVar3;
  JavascriptLibrary *library;
  code *pcVar4;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar5;
  Var value_00;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *this_00;
  ScriptContext *this_01;
  bool bVar6;
  bool bVar7;
  PropertyTypes PVar8;
  BOOL BVar9;
  PropertyId propertyId;
  undefined4 *puVar10;
  BigDictionaryTypeHandler *this_02;
  PropertyAttributes PVar11;
  undefined7 in_register_00000081;
  DictionaryPropertyDescriptor<unsigned_short> *local_78;
  DictionaryPropertyDescriptor<unsigned_short> *descriptor;
  Var local_68;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_60;
  ScriptContext *local_58;
  PropertyValueInfo *local_50;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord_local;
  DictionaryPropertyDescriptor<unsigned_short> newDescriptor;
  
  newDescriptor._4_4_ = SUB84(CONCAT71(in_register_00000081,attributes),0);
  local_50 = info;
  local_48 = propertyRecord;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x862,"(instance)","instance");
    if (!bVar6) goto LAB_00da20d1;
    *puVar10 = 0;
  }
  local_58 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  newDescriptor._0_4_ = propertyRecord->pid;
  bVar6 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_48,&local_78,(int *)&propertyRecord_local);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x868,
                                "(!propertyMap->TryGetReference(propertyRecord, &descriptor))",
                                "!propertyMap->TryGetReference(propertyRecord, &descriptor)");
    if (!bVar6) goto LAB_00da20d1;
    *puVar10 = 0;
  }
  if (local_48->isNumeric == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x869,"(!propertyRecord->IsNumeric())",
                                "!propertyRecord->IsNumeric()");
    if (!bVar6) goto LAB_00da20d1;
    *puVar10 = 0;
  }
  if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
     (bVar6 = DynamicTypeHandler::VerifyIsExtensible
                        (&this->super_DynamicTypeHandler,local_58,throwIfNotExtensible), !bVar6)) {
    return 0;
  }
  iVar2 = (this->super_DynamicTypeHandler).slotCapacity;
  propertyRecord_local._2_2_ = this->nextPropertyIndex;
  if (iVar2 <= (int)(uint)propertyRecord_local._2_2_) {
    if ((0xfffd < iVar2) || (DAT_015bf340 <= iVar2)) {
      this_02 = ConvertToBigDictionaryTypeHandler(this,instance);
      BVar9 = DictionaryTypeHandlerBase<int>::AddProperty
                        (this_02,instance,local_48,value,(PropertyAttributes)newDescriptor.Getter,
                         local_50,flags,false,possibleSideEffects);
      return BVar9;
    }
    EnsureSlotCapacity(this,instance,1);
    propertyRecord_local._2_2_ = this->nextPropertyIndex;
  }
  descriptor = (DictionaryPropertyDescriptor<unsigned_short> *)(ulong)propertyRecord_local._2_2_;
  if (propertyRecord_local._2_2_ == 0xffff) {
    ::Math::DefaultOverflowPolicy();
  }
  this->nextPropertyIndex = propertyRecord_local._2_2_ + 1;
  propertyRecord_local._0_1_ = 1;
  propertyRecord_local._1_1_ = (undefined1)newDescriptor.Getter;
  propertyRecord_local._4_4_ = 0xffffffff;
  if (((this->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x884,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar6) goto LAB_00da20d1;
    *puVar10 = 0;
  }
  pRVar3 = (this->singletonInstance).ptr;
  if (pRVar3 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    if ((DynamicObject *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef == instance) {
      if (((flags & PropertyOperation_PreInit) == PropertyOperation_None) &&
         (propertyRecord_local._0_1_ = 9,
         (flags & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
         PropertyOperation_None && 0xf < (uint)newDescriptor._0_4_)) {
        if (value == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x88f,"(value != nullptr)","value != nullptr");
          if (!bVar6) goto LAB_00da20d1;
          *puVar10 = 0;
        }
        BVar9 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar9 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x891,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar6) goto LAB_00da20d1;
          *puVar10 = 0;
        }
        bVar6 = VarIs<Js::JavascriptFunction>(value);
        if (bVar6) {
          bVar7 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
          bVar7 = !bVar7;
        }
        else {
          bVar6 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
          bVar7 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_48,value);
          bVar7 = bVar7 && !bVar6;
        }
        propertyRecord_local._0_1_ = bVar7 << 5 | 9;
      }
      goto LAB_00da1f51;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x887,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar6) {
LAB_00da20d1:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  if ((flags & PropertyOperation_PreInit) == PropertyOperation_None) {
    propertyRecord_local._0_1_ = 9;
  }
LAB_00da1f51:
  local_68 = value;
  JsUtil::
  BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)(this->propertyMap).ptr,&local_48,
             (DictionaryPropertyDescriptor<unsigned_short> *)&propertyRecord_local);
  if ((newDescriptor._4_4_ & 1) != 0) {
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
  }
  library = (local_58->super_ScriptContextBase).javascriptLibrary;
  Memory::Recycler::WBSetBit((char *)&local_60);
  local_60 = (PrototypeChainCache<Js::NoSpecialPropertyCache> *)
             &library->typesWithOnlyWritablePropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
  this_00 = local_60;
  if (((newDescriptor._4_4_ & 4) == 0) &&
     (DynamicTypeHandler::SetHasOnlyWritableDataProperties(&this->super_DynamicTypeHandler,false),
     this_01 = local_58, ((this->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(local_58,newDescriptor._0_4_);
    ScriptContext::InvalidateStoreFieldCaches(this_01,propertyId);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear
              ((PrototypeChainCache<Js::OnlyWritablePropertyCache> *)this_00);
  }
  bVar6 = NoSpecialPropertyCache::IsSpecialProperty(newDescriptor._0_4_);
  value_00 = local_68;
  if ((bVar6) &&
     (PVar8 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler),
     -1 < (char)PVar8)) {
    bVar6 = NoSpecialPropertyCache::IsDefaultSpecialProperty(instance,library,newDescriptor._0_4_);
    if (bVar6) {
      if (local_50 != (PropertyValueInfo *)0x0) {
        local_50->m_instance = &instance->super_RecyclableObject;
        local_50->m_propertyIndex = 0xffff;
        local_50->m_attributes = '\0';
        local_50->flags = InlineCacheNoFlags;
      }
    }
    else {
      pTVar1 = &(this->super_DynamicTypeHandler).propertyTypes;
      *pTVar1 = *pTVar1 | 0x80;
      if (((this->super_DynamicTypeHandler).flags & 0x20) != 0) {
        Memory::Recycler::WBSetBit((char *)&local_60);
        local_60 = &library->typesWithNoSpecialPropertyProtoChain;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
        PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(local_60);
      }
    }
  }
  pDVar5 = descriptor;
  DynamicTypeHandler::SetSlotUnchecked(instance,(uint)descriptor & 0xffff,value_00);
  if (local_50 != (PropertyValueInfo *)0x0) {
    PVar11 = (PropertyAttributes)newDescriptor.Getter;
    if (((byte)propertyRecord_local & 0x20) != 0) {
      PVar11 = '\0';
    }
    local_50->m_instance = &instance->super_RecyclableObject;
    local_50->m_propertyIndex = -(ushort)(((byte)propertyRecord_local & 0x20) != 0) | (ushort)pDVar5
    ;
    local_50->m_attributes = PVar11;
    local_50->flags = InlineCacheNoFlags;
  }
  ScriptContext::InvalidateProtoCaches(local_58,local_48->pid);
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,local_48->pid,value_00,possibleSideEffects);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::AddProperty(DynamicObject* instance, const PropertyRecord* propertyRecord, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, bool throwIfNotExtensible, SideEffects possibleSideEffects)
    {
        AnalysisAssert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        PropertyId propertyId = propertyRecord->GetPropertyId();
#if DBG
        DictionaryPropertyDescriptor<T>* descriptor;
        Assert(!propertyMap->TryGetReference(propertyRecord, &descriptor));
        Assert(!propertyRecord->IsNumeric());
#endif

        if (!isForce)
        {
            if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
            {
                return FALSE;
            }
        }

        if (this->GetSlotCapacity() <= nextPropertyIndex)
        {
            if (this->GetSlotCapacity() >= MaxPropertyIndexSize ||
                (this->GetSlotCapacity() >= CONFIG_FLAG(BigDictionaryTypeHandlerThreshold) && !this->IsBigDictionaryTypeHandler()))
            {
                BigDictionaryTypeHandler* newTypeHandler = ConvertToBigDictionaryTypeHandler(instance);

                return newTypeHandler->AddProperty(instance, propertyRecord, value, attributes, info, flags, false, possibleSideEffects);
            }
            this->EnsureSlotCapacity(instance);
        }

        T index = ::Math::PostInc(nextPropertyIndex);
        DictionaryPropertyDescriptor<T> newDescriptor(index, attributes);

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);

        if ((flags & PropertyOperation_PreInit) == 0)
        {
            newDescriptor.SetIsInitialized(true);
            if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
            {
                Assert(value != nullptr);
                // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                Assert(!instance->IsExternal());
                newDescriptor.SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() & CheckHeuristicsForFixedDataProps(instance, propertyRecord, value)));
            }
        }
#endif

        propertyMap->Add(propertyRecord, newDescriptor);

        if (attributes & PropertyEnumerable)
        {
            instance->SetHasNoEnumerableProperties(false);
        }
        JavascriptLibrary* library = scriptContext->GetLibrary();

        library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, attributes, propertyId, scriptContext);
        if (NoSpecialPropertyCache::IsSpecialProperty(propertyId) && !this->GetHasSpecialProperties())
        {
            if (!NoSpecialPropertyCache::IsDefaultSpecialProperty(instance, library, propertyId))
            {
                this->SetHasSpecialProperties();
                if (GetFlags() & IsPrototypeFlag)
                {
                    library->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
                }
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        SetSlotUnchecked(instance, index, value);

#if ENABLE_FIXED_FIELDS
        // If we just added a fixed method, don't populate the inline cache so that we always take the
        // slow path when overwriting this property and correctly invalidate any JIT-ed code that hard-coded
        // this method.
        if (newDescriptor.GetIsFixed())
        {
            PropertyValueInfo::SetNoCache(info, instance);
        }
        else
#endif
        {
            SetPropertyValueInfoNonFixed(info, instance, index, attributes);
        }

        // Always invalidate prototype caches when we add a property.  Previously, we only did this if the current
        // type is used as a prototype, or if the new property is also found on the prototype chain (because
        // adding a new field doesn't create a new dictionary type).  However, if the new property is already in
        // the cache as a missing property, we have to invalidate the prototype caches.
        scriptContext->InvalidateProtoCaches(propertyRecord->GetPropertyId());

        SetPropertyUpdateSideEffect(instance, propertyRecord->GetPropertyId(), value, possibleSideEffects);
        return true;
    }